

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall CLPIParser::parseExtensionData(CLPIParser *this,uint8_t *buffer,uint8_t *end)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint dataLength;
  BitStreamReader reader;
  int local_70;
  BitStreamReader local_50;
  
  local_50.super_BitStream.m_totalBits = 0;
  local_50.super_BitStream.m_buffer = (uint *)0x0;
  local_50.super_BitStream.m_initBuffer = (uint *)0x0;
  local_50.m_curVal = 0;
  local_50.m_bitLeft = 0;
  BitStream::setBuffer(&local_50.super_BitStream,buffer,end);
  local_50._24_8_ = local_50._24_8_ & 0xffffffff;
  local_50.m_curVal = BitStreamReader::getCurVal(&local_50,local_50.super_BitStream.m_buffer);
  local_50.m_bitLeft = 0x20;
  uVar1 = BitStreamReader::getBits(&local_50,0x20);
  if (uVar1 != 0) {
    BitStreamReader::skipBits(&local_50,0x20);
    BitStreamReader::skipBits(&local_50,0x18);
    uVar1 = BitStreamReader::getBits(&local_50,8);
    if (0 < (int)uVar1) {
      local_70 = (int)buffer;
      do {
        uVar2 = BitStreamReader::getBits(&local_50,0x20);
        uVar3 = BitStreamReader::getBits(&local_50,0x20);
        dataLength = BitStreamReader::getBits(&local_50,0x20);
        if ((uint)((int)end - local_70) < dataLength + uVar3) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Invalid extended clip info entry skipped.",0x29);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
          std::ostream::put('\x10');
          std::ostream::flush();
          sLastMsg = true;
        }
        else if (uVar2 == 0x20006) {
          parseCPI(buffer + uVar3,buffer + uVar3 + dataLength);
        }
        else if (uVar2 == 0x20005) {
          parseProgramInfo(buffer + uVar3,buffer + uVar3 + dataLength,&this->m_programInfoMVC,
                           &this->m_streamInfoMVC);
        }
        else if (uVar2 == 0x20004) {
          Extent_Start_Point(this,buffer + uVar3,dataLength);
        }
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
  }
  return;
}

Assistant:

void CLPIParser::parseExtensionData(uint8_t* buffer, const uint8_t* end)
{
    // added for 3D compatibility
    BitStreamReader reader{};
    reader.setBuffer(buffer, end);
    if (reader.getBits(32) == 0)  // length
        return;

    reader.skipBits(32);  // data_block_start_address
    reader.skipBits(24);
    const int entries = reader.getBits<int>(8);
    for (int i = 0; i < entries; ++i)
    {
        const uint32_t dataID = reader.getBits(32);
        const uint32_t dataAddress = reader.getBits(32);
        const uint32_t dataLength = reader.getBits(32);

        if (dataAddress + dataLength > static_cast<uint32_t>(end - buffer))
        {
            LTRACE(LT_WARN, 2, "Invalid extended clip info entry skipped.");
            continue;
        }

        switch (dataID)
        {
        case 0x00010002:
            HDMV_LPCM_down_mix_coefficient(buffer + dataAddress, dataLength);
            break;
        case 0x00020004:
            Extent_Start_Point(buffer + dataAddress, dataLength);
            break;
        case 0x00020005:
            ProgramInfo_SS(buffer + dataAddress, dataLength);
            break;
        case 0x00020006:
            CPI_SS(buffer + dataAddress, dataLength);
            break;
        default:;
        }
    }
}